

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O2

void __thiscall
KDReports::SpreadsheetReportLayout::paintIcon
          (SpreadsheetReportLayout *this,QPainter *painter,QRectF *cellContentsRect,
          QVariant *cellDecoration)

{
  char cVar1;
  int iVar2;
  int iVar3;
  QPoint QVar4;
  double dVar5;
  QImage img;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QPixmap pix;
  QPoint topLeft;
  
  qvariant_cast<QPixmap>((QVariant *)&pix);
  cVar1 = QPixmap::isNull();
  if (cVar1 != '\0') {
    qvariant_cast<QIcon>((QVariant *)&local_68);
    QIcon::pixmap((QSize *)&img,(Mode)&local_68,(int)this + 0x88);
    QPixmap::operator=(&pix,(QPixmap *)&img);
    QPixmap::~QPixmap((QPixmap *)&img);
    QIcon::~QIcon((QIcon *)&local_68.shared);
  }
  iVar2 = QPixmap::height();
  QImage::QImage(&img);
  cVar1 = QPixmap::isNull();
  if (cVar1 != '\0') {
    qvariant_cast<QImage>((QVariant *)&local_68);
    QImage::operator=(&img,(QImage *)local_68.data);
    QImage::~QImage((QImage *)local_68.data);
    cVar1 = QImage::isNull();
    if (cVar1 != '\0') goto LAB_0014ce04;
    iVar2 = QImage::height();
  }
  dVar5 = (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    cVar1 = QPixmap::isNull();
    if (cVar1 == '\0') {
      iVar2 = QPixmap::width();
      dVar5 = (double)iVar2 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QPixmap::scaledToWidth
                (&local_68,&pix,
                 (int)((double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_001519e0) + dVar5),0)
      ;
      QPixmap::operator=(&pix,(QPixmap *)local_68.data);
      QPixmap::~QPixmap((QPixmap *)local_68.data);
      iVar2 = QPixmap::height();
    }
    else {
      iVar2 = QImage::width();
      dVar5 = (double)iVar2 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QImage::scaledToWidth
                (&local_68,&img,
                 (int)((double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_001519e0) + dVar5),0)
      ;
      QImage::operator=(&img,(QImage *)local_68.data);
      QImage::~QImage((QImage *)local_68.data);
      iVar2 = QImage::height();
    }
  }
  iVar3 = (int)((cellContentsRect->h - (double)iVar2) * 0.5);
  iVar2 = 0;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  local_68.shared = (PrivateShared *)cellContentsRect->xp;
  local_68._8_8_ = cellContentsRect->yp;
  QVar4 = QPointF::toPoint((QPointF *)&local_68);
  topLeft = (QPoint)((ulong)QVar4 & 0xffffffff | (ulong)(uint)(QVar4.yp + iVar2) << 0x20);
  cVar1 = QImage::isNull();
  if (cVar1 == '\0') {
    QPainter::drawImage(painter,&topLeft,&img);
  }
  else {
    QPainter::drawPixmap(painter,&topLeft,&pix);
  }
LAB_0014ce04:
  QImage::~QImage(&img);
  QPixmap::~QPixmap(&pix);
  return;
}

Assistant:

void KDReports::SpreadsheetReportLayout::paintIcon(QPainter &painter, const QRectF &cellContentsRect, const QVariant &cellDecoration) const
{
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (pix.isNull()) {
        pix = qvariant_cast<QIcon>(cellDecoration).pixmap(m_tableLayout.m_iconSize);
    }
    qreal height = pix.height();
    QImage img;
    if (pix.isNull()) {
        img = qvariant_cast<QImage>(cellDecoration);
        if (img.isNull())
            return;
        height = img.height();
    }

    // Now either img or pix is set.

    // Apply scaling factor
    if (m_tableLayout.scalingFactor() != 1.) {
        if (!pix.isNull()) {
            pix = pix.scaledToWidth(qRound(pix.width() * m_tableLayout.scalingFactor()));
            height = pix.height();
        } else {
            img = img.scaledToWidth(qRound(img.width() * m_tableLayout.scalingFactor()));
            height = img.height();
        }
    }

    // Vertical centering
    const int y = qMax(0, int((cellContentsRect.height() - height) / 2.0));
    const QPoint topLeft = cellContentsRect.topLeft().toPoint() + QPoint(0, y);
    if (!img.isNull()) {
        // Draw img
        painter.drawImage(topLeft, img);
    } else {
        // Draw pix
        painter.drawPixmap(topLeft, pix);
    }
}